

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O2

void asm_neg_not(ASMState *as,IRIns *ir,x86Group3 xg)

{
  uint uVar1;
  Reg r2;
  
  r2 = ra_dest(as,ir,0xbfef);
  uVar1._0_2_ = *(IROpT *)((long)ir + 4);
  uVar1._2_2_ = *(IRRef1 *)((long)ir + 6);
  emit_rr(as,XO_GROUP3,(-(uint)((0x605fd9U >> (uVar1 & 0x1f) & 1) != 0) & 0x80200) + xg,r2);
  ra_left(as,r2,(uint)(ir->field_0).op1);
  return;
}

Assistant:

static void asm_neg_not(ASMState *as, IRIns *ir, x86Group3 xg)
{
  Reg dest = ra_dest(as, ir, RSET_GPR);
  emit_rr(as, XO_GROUP3, REX_64IR(ir, xg), dest);
  ra_left(as, dest, ir->op1);
}